

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

NamespaceData * __thiscall
anon_unknown.dwarf_9c70f::FindNamespaceInCurrentScope
          (anon_unknown_dwarf_9c70f *this,ExpressionContext *ctx,InplaceStr name)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  ScopeData *curr;
  undefined8 *puVar4;
  anon_unknown_dwarf_9c70f *paVar5;
  anon_unknown_dwarf_9c70f *paVar6;
  ulong uVar7;
  InplaceStr local_38;
  
  local_38.end = name.begin;
  puVar4 = *(undefined8 **)(this + 0x8158);
  do {
    if (puVar4 == (undefined8 *)0x0) {
      paVar5 = this + 0x8170;
      paVar6 = this + 0x8178;
LAB_00175ee2:
      uVar1 = *(uint *)paVar6;
      if ((ulong)uVar1 != 0) {
        lVar2 = *(long *)paVar5;
        uVar7 = 0;
        local_38.begin = (char *)ctx;
        do {
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)(*(long *)(lVar2 + uVar7 * 8) + 0x80),&local_38);
          if (bVar3) {
            return *(NamespaceData **)(lVar2 + uVar7 * 8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      return (NamespaceData *)0x0;
    }
    lVar2 = puVar4[2];
    if (lVar2 != 0) {
      paVar5 = (anon_unknown_dwarf_9c70f *)(lVar2 + 0x18);
      paVar6 = (anon_unknown_dwarf_9c70f *)(lVar2 + 0x20);
      goto LAB_00175ee2;
    }
    puVar4 = (undefined8 *)*puVar4;
  } while( true );
}

Assistant:

NamespaceData* FindNamespaceInCurrentScope(ExpressionContext &ctx, InplaceStr name)
	{
		ArrayView<NamespaceData*> namespaces;

		if(NamespaceData *ns = ctx.GetCurrentNamespace(ctx.scope))
			namespaces = ns->children;
		else
			namespaces = ctx.globalNamespaces;

		for(unsigned i = 0; i < namespaces.size(); i++)
		{
			if(namespaces[i]->name.name == name)
				return namespaces[i];
		}

		return NULL;
	}